

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

void __thiscall
Semantic::Err::UndeclaredLocalVariable::~UndeclaredLocalVariable(UndeclaredLocalVariable *this)

{
  this->super_Error = (Error)&PTR__UndeclaredLocalVariable_00145440;
  std::__cxx11::string::~string((string *)&this->varName);
  std::exception::~exception((exception *)this);
  return;
}

Assistant:

UndeclaredLocalVariable(std::string varName) : Error() {
                this->varName = varName;
            }